

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int map_assign(wally_map *src,wally_map *dst,_func_int_uchar_ptr_size_t *check_fn)

{
  bool bVar1;
  int local_44;
  ulong uStack_40;
  int ret;
  size_t i;
  wally_map result;
  _func_int_uchar_ptr_size_t *check_fn_local;
  wally_map *dst_local;
  wally_map *src_local;
  
  result.items_allocation_len = (size_t)check_fn;
  if (src == (wally_map *)0x0) {
    local_44 = wally_map_init(0,(wally_map *)&i);
  }
  else {
    local_44 = wally_map_init(src->items_allocation_len,(wally_map *)&i);
    uStack_40 = 0;
    while( true ) {
      bVar1 = false;
      if (local_44 == 0) {
        bVar1 = uStack_40 < src->num_items;
      }
      if (!bVar1) break;
      local_44 = map_add((wally_map *)&i,src->items[uStack_40].key,src->items[uStack_40].key_len,
                         src->items[uStack_40].value,src->items[uStack_40].value_len,false,
                         (_func_int_uchar_ptr_size_t *)result.items_allocation_len,true);
      uStack_40 = uStack_40 + 1;
    }
  }
  if (local_44 == 0) {
    wally_map_clear(dst);
    dst->items = (wally_map_item *)i;
    dst->num_items = (size_t)result.items;
    dst->items_allocation_len = result.num_items;
  }
  else {
    wally_map_clear((wally_map *)&i);
  }
  return local_44;
}

Assistant:

static int map_assign(const struct wally_map *src, struct wally_map *dst,
                      int (*check_fn)(const unsigned char *key, size_t key_len))
{
    struct wally_map result;
    size_t i;
    int ret = WALLY_OK;

    if (!src)
        ret = wally_map_init(0, &result);
    else {
        ret = wally_map_init(src->items_allocation_len, &result);
        for (i = 0; ret == WALLY_OK && i < src->num_items; ++i)
            ret = map_add(&result, src->items[i].key, src->items[i].key_len,
                          src->items[i].value, src->items[i].value_len,
                          false, check_fn, true);
    }

    if (ret != WALLY_OK)
        wally_map_clear(&result);
    else {
        wally_map_clear(dst);
        memcpy(dst, &result, sizeof(result));
    }
    return ret;
}